

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O0

void __thiscall
Encoder::ValidateCRCOnFinalBuffer
          (Encoder *this,BYTE *finalCodeBufferStart,size_t finalCodeSize,size_t jumpTableSize,
          BYTE *oldCodeBufferStart,uint initialCrcSeed,uint bufferCrcToValidate,
          BOOL isSuccessBrShortAndLoopAlign)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  Type *reloc;
  BYTE *pBVar5;
  undefined4 *puVar6;
  uint local_90;
  uint i;
  uint relocDataSize;
  BYTE *finalBufferRelocTuplePtr;
  EncodeRelocAndLabels *relocTuple;
  BYTE *pBStack_70;
  int index;
  BYTE *oldPtr;
  long lStack_60;
  uint finalBufferCRC;
  size_t finalCodeSizeWithoutJumpTable;
  size_t crcSizeToCompute;
  BYTE *currentEndAddress;
  BYTE *currentStartAddress;
  RelocList *relocList;
  BYTE *pBStack_30;
  uint initialCrcSeed_local;
  BYTE *oldCodeBufferStart_local;
  size_t jumpTableSize_local;
  size_t finalCodeSize_local;
  BYTE *finalCodeBufferStart_local;
  Encoder *this_local;
  
  relocList._4_4_ = initialCrcSeed;
  pBStack_30 = oldCodeBufferStart;
  oldCodeBufferStart_local = (BYTE *)jumpTableSize;
  jumpTableSize_local = finalCodeSize;
  finalCodeSize_local = (size_t)finalCodeBufferStart;
  finalCodeBufferStart_local = (BYTE *)this;
  currentStartAddress = (BYTE *)EncoderMD::GetRelocList(&this->m_encoderMD);
  currentEndAddress = (BYTE *)finalCodeSize_local;
  crcSizeToCompute = 0;
  finalCodeSizeWithoutJumpTable = 0;
  lStack_60 = jumpTableSize_local - (long)oldCodeBufferStart_local;
  oldPtr._4_4_ = relocList._4_4_;
  pBStack_70 = (BYTE *)0x0;
  if ((RelocList *)currentStartAddress != (RelocList *)0x0) {
    for (relocTuple._4_4_ = 0;
        iVar3 = JsUtil::ReadOnlyList<EncodeRelocAndLabels,_Memory::ArenaAllocator,_DefaultComparer>
                ::Count((ReadOnlyList<EncodeRelocAndLabels,_Memory::ArenaAllocator,_DefaultComparer>
                         *)currentStartAddress), relocTuple._4_4_ < iVar3;
        relocTuple._4_4_ = relocTuple._4_4_ + 1) {
      reloc = JsUtil::
              List<EncodeRelocAndLabels,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item((List<EncodeRelocAndLabels,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      *)currentStartAddress,relocTuple._4_4_);
      pBVar5 = EncoderMD::GetRelocBufferAddress(&this->m_encoderMD,reloc);
      if ((pBStack_30 <= pBVar5) &&
         (pBVar5 = EncoderMD::GetRelocBufferAddress(&this->m_encoderMD,reloc),
         pBVar5 < pBStack_30 + lStack_60)) {
        pBVar5 = EncoderMD::GetRelocBufferAddress(&this->m_encoderMD,reloc);
        pBVar5 = pBVar5 + (finalCodeSize_local - (long)pBStack_30);
        if ((pBVar5 < finalCodeSize_local) || ((BYTE *)(finalCodeSize_local + lStack_60) <= pBVar5))
        {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                             ,0x42b,
                             "(finalBufferRelocTuplePtr >= finalCodeBufferStart && finalBufferRelocTuplePtr < (finalCodeBufferStart + finalCodeSizeWithoutJumpTable))"
                             ,
                             "finalBufferRelocTuplePtr >= finalCodeBufferStart && finalBufferRelocTuplePtr < (finalCodeBufferStart + finalCodeSizeWithoutJumpTable)"
                            );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        uVar4 = EncoderMD::GetRelocDataSize(&this->m_encoderMD,reloc);
        if (uVar4 != 0) {
          if ((pBStack_70 != (BYTE *)0x0) && (pBVar5 <= pBStack_70)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                               ,0x42f,"(oldPtr == nullptr || oldPtr < finalBufferRelocTuplePtr)",
                               "Assumption here is that the reloc list is strictly increasing in terms of bufferAddress"
                              );
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
          finalCodeSizeWithoutJumpTable = (long)pBVar5 - (long)currentEndAddress;
          crcSizeToCompute = (size_t)pBVar5;
          if (pBVar5 < currentEndAddress) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                               ,0x435,"(currentEndAddress >= currentStartAddress)",
                               "currentEndAddress >= currentStartAddress");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
          oldPtr._4_4_ = CalculateCRC(oldPtr._4_4_,finalCodeSizeWithoutJumpTable,currentEndAddress);
          for (local_90 = 0; local_90 < uVar4; local_90 = local_90 + 1) {
            oldPtr._4_4_ = CalculateCRC(oldPtr._4_4_,0);
          }
          currentEndAddress = (BYTE *)(crcSizeToCompute + uVar4);
          pBStack_70 = pBVar5;
        }
      }
    }
  }
  crcSizeToCompute = finalCodeSize_local + lStack_60;
  finalCodeSizeWithoutJumpTable = crcSizeToCompute - (long)currentEndAddress;
  if (crcSizeToCompute < currentEndAddress) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                       ,0x445,"(currentEndAddress >= currentStartAddress)",
                       "currentEndAddress >= currentStartAddress");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  oldPtr._4_4_ = CalculateCRC(oldPtr._4_4_,finalCodeSizeWithoutJumpTable,currentEndAddress);
  EncoderMD::ApplyRelocs
            (&this->m_encoderMD,finalCodeSize_local,jumpTableSize_local,(uint *)((long)&oldPtr + 4),
             isSuccessBrShortAndLoopAlign,true);
  if (oldPtr._4_4_ == bufferCrcToValidate) {
    return;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar6 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                     ,0x44e,"(false)","false");
  if (bVar2) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
    Js::Throw::FatalInternalError(-0x7fffbffb);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void Encoder::ValidateCRCOnFinalBuffer(_In_reads_bytes_(finalCodeSize) BYTE * finalCodeBufferStart, size_t finalCodeSize, size_t jumpTableSize, _In_reads_bytes_(finalCodeSize) BYTE * oldCodeBufferStart, uint initialCrcSeed, uint bufferCrcToValidate, BOOL isSuccessBrShortAndLoopAlign)
{
    RelocList * relocList = m_encoderMD.GetRelocList();

    BYTE * currentStartAddress = finalCodeBufferStart;
    BYTE * currentEndAddress = nullptr;
    size_t crcSizeToCompute = 0;

    size_t finalCodeSizeWithoutJumpTable = finalCodeSize - jumpTableSize;

    uint finalBufferCRC = initialCrcSeed;

    BYTE * oldPtr = nullptr;

    if (relocList != nullptr)
    {
        for (int index = 0; index < relocList->Count(); index++)
        {
            EncodeRelocAndLabels * relocTuple = &relocList->Item(index);

            //We will deal with the jump table and dictionary entries along with other reloc records in ApplyRelocs()
            if ((BYTE*)m_encoderMD.GetRelocBufferAddress(relocTuple) >= oldCodeBufferStart && (BYTE*)m_encoderMD.GetRelocBufferAddress(relocTuple) < (oldCodeBufferStart + finalCodeSizeWithoutJumpTable))
            {
                BYTE* finalBufferRelocTuplePtr = (BYTE*)m_encoderMD.GetRelocBufferAddress(relocTuple) - oldCodeBufferStart + finalCodeBufferStart;
                Assert(finalBufferRelocTuplePtr >= finalCodeBufferStart && finalBufferRelocTuplePtr < (finalCodeBufferStart + finalCodeSizeWithoutJumpTable));
                uint relocDataSize = m_encoderMD.GetRelocDataSize(relocTuple);
                if (relocDataSize != 0)
                {
                    AssertMsg(oldPtr == nullptr || oldPtr < finalBufferRelocTuplePtr, "Assumption here is that the reloc list is strictly increasing in terms of bufferAddress");
                    oldPtr = finalBufferRelocTuplePtr;

                    currentEndAddress = finalBufferRelocTuplePtr;
                    crcSizeToCompute = currentEndAddress - currentStartAddress;

                    Assert(currentEndAddress >= currentStartAddress);

                    finalBufferCRC = CalculateCRC(finalBufferCRC, crcSizeToCompute, currentStartAddress);
                    for (uint i = 0; i < relocDataSize; i++)
                    {
                        finalBufferCRC = CalculateCRC(finalBufferCRC, 0);
                    }
                    currentStartAddress = currentEndAddress + relocDataSize;
                }
            }
        }
    }

    currentEndAddress = finalCodeBufferStart + finalCodeSizeWithoutJumpTable;
    crcSizeToCompute = currentEndAddress - currentStartAddress;

    Assert(currentEndAddress >= currentStartAddress);

    finalBufferCRC = CalculateCRC(finalBufferCRC, crcSizeToCompute, currentStartAddress);

    //Include all offsets from the reloc records to the CRC.
    m_encoderMD.ApplyRelocs((size_t)finalCodeBufferStart, finalCodeSize, &finalBufferCRC, isSuccessBrShortAndLoopAlign, true);

    if (finalBufferCRC != bufferCrcToValidate)
    {
        Assert(false);
        Fatal();
    }
}